

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

bool __thiscall
slang::parsing::Lexer::scanUTF8Char(Lexer *this,bool alreadyErrored,uint32_t *code,int *computedLen)

{
  uint uVar1;
  char *b;
  char *pcVar2;
  char *pcVar3;
  undefined7 in_register_00000031;
  int iVar4;
  char *__n;
  int error;
  char buf [4];
  int local_3c;
  undefined4 local_38;
  char local_34 [4];
  
  local_38 = (undefined4)CONCAT71(in_register_00000031,alreadyErrored);
  b = this->sourceBuffer;
  if (b + 4 < this->sourceEnd) {
    pcVar2 = utf8Decode(b,code,&local_3c,computedLen);
  }
  else {
    local_34[0] = '\0';
    local_34[1] = '\0';
    local_34[2] = '\0';
    local_34[3] = '\0';
    __n = this->sourceEnd + ~(ulong)b;
    memcpy(local_34,b,(size_t)__n);
    pcVar3 = utf8Decode(local_34,code,&local_3c,computedLen);
    pcVar2 = pcVar3 + -(long)local_34;
    if ((long)__n < (long)(pcVar3 + -(long)local_34)) {
      pcVar2 = __n;
    }
    pcVar2 = pcVar2 + (long)this->sourceBuffer;
    iVar4 = (int)__n;
    if (*computedLen < (int)__n) {
      iVar4 = *computedLen;
    }
    *computedLen = iVar4;
  }
  this->sourceBuffer = pcVar2;
  if (local_3c == 0) goto LAB_00294ac3;
  uVar1 = *computedLen;
  if (1 < (int)uVar1) {
    if (b[1] < ' ') {
      pcVar2 = b + 1;
    }
    else {
      if (uVar1 == 2) goto LAB_00294aa8;
      if (b[2] < ' ') {
        pcVar2 = b + 2;
      }
      else {
        if ((uVar1 < 4) || ('\x1f' < b[3])) goto LAB_00294aa8;
        pcVar2 = b + 3;
      }
    }
    this->sourceBuffer = pcVar2;
  }
LAB_00294aa8:
  if ((char)local_38 == '\0') {
    addDiag(this,(DiagCode)0x140002,(long)b - (long)this->originalBegin);
  }
LAB_00294ac3:
  return local_3c == 0;
}

Assistant:

bool Lexer::scanUTF8Char(bool alreadyErrored, uint32_t* code, int& computedLen) {
    int error;
    auto curr = sourceBuffer;
    if (sourceBuffer + 4 < sourceEnd) {
        sourceBuffer = utf8Decode(sourceBuffer, code, &error, computedLen);
    }
    else {
        char buf[4] = {};
        auto spaceLeft = sourceEnd - sourceBuffer - 1;
        memcpy(buf, sourceBuffer, size_t(spaceLeft));

        auto next = utf8Decode(buf, code, &error, computedLen);
        sourceBuffer += std::min(next - buf, spaceLeft);
        computedLen = std::min(computedLen, (int)spaceLeft);
    }

    if (error) {
        // if error, trim next pointer so that control char is read as next char
        if ((computedLen > 1) && (curr[1] < 0x20))
            sourceBuffer = curr + 1;
        else if ((computedLen > 2) && (curr[2] < 0x20))
            sourceBuffer = curr + 2;
        else if ((computedLen > 3) && (curr[3] < 0x20))
            sourceBuffer = curr + 3;

        if (!alreadyErrored)
            addDiag(diag::InvalidUTF8Seq, (size_t)(curr - originalBegin));
        return false;
    }

    return true;
}